

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionCall1(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   bool allowFailure,bool allowInternal,bool allowFastLookup)

{
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments_00;
  SmallArray<ArgumentData,_1U> arguments;
  ArgumentData local_58;
  
  arguments.allocator = ctx->allocator;
  arguments.data = arguments.little;
  arguments.little[0].source = (SynBase *)0x0;
  arguments.little[0].isExplicit = false;
  arguments.little[0].name = (SynIdentifier *)0x0;
  arguments.little[0].type = (TypeBase *)0x0;
  arguments.little[0].value = (ExprBase *)0x0;
  arguments.little[0].valueFunction = (FunctionData *)0x0;
  arguments.count = 0;
  arguments.max = 1;
  local_58.source = arg0->source;
  local_58.type = arg0->type;
  local_58.isExplicit = false;
  local_58.name = (SynIdentifier *)0x0;
  local_58.valueFunction = (FunctionData *)0x0;
  local_58.value = arg0;
  SmallArray<ArgumentData,_1U>::push_back(&arguments,&local_58);
  arguments_00.count = arguments.count;
  arguments_00.data = arguments.data;
  arguments_00._12_4_ = 0;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name,arguments_00,allowFailure,allowInternal,allowFastLookup);
  SmallArray<ArgumentData,_1U>::~SmallArray(&arguments);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall1(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 1> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}